

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wiener_convolve_sse2.c
# Opt level: O1

void av1_wiener_convolve_add_src_sse2
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,
               WienerConvolveParams *conv_params)

{
  short sVar1;
  ushort *puVar9;
  undefined2 *puVar10;
  undefined2 *puVar11;
  undefined2 *puVar12;
  undefined2 *puVar13;
  short sVar14;
  short sVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  char cVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [13];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [11];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  undefined4 uVar103;
  long lVar104;
  uint8_t *puVar105;
  ulong uVar106;
  ulong uVar107;
  long lVar108;
  int iVar109;
  undefined4 uVar113;
  undefined1 auVar110 [12];
  undefined4 uVar114;
  undefined4 uVar115;
  undefined1 auVar112 [16];
  undefined1 auVar116 [12];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 uVar135;
  undefined1 uVar136;
  undefined1 uVar137;
  undefined1 uVar138;
  undefined1 uVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar163 [16];
  undefined1 auVar167 [16];
  ushort auStack_8728 [16];
  undefined1 auStack_8708 [16];
  undefined1 auStack_86f8 [16];
  undefined1 auStack_86e8 [16];
  undefined1 auStack_86d8 [16];
  undefined1 auStack_86c8 [16];
  undefined1 auStack_86b8 [144];
  undefined2 auStack_8628 [128];
  undefined1 auStack_8528 [256];
  undefined2 auStack_8428 [128];
  undefined1 auStack_8328 [256];
  undefined2 auStack_8228 [128];
  undefined1 auStack_8128 [256];
  undefined2 local_8028 [16384];
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar111 [16];
  undefined1 auVar122 [16];
  undefined1 auVar126 [16];
  undefined1 auVar123 [16];
  undefined1 auVar127 [16];
  undefined1 auVar124 [16];
  undefined1 auVar128 [16];
  undefined1 uVar147;
  undefined1 uVar148;
  undefined1 uVar153;
  undefined1 uVar154;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 uVar162;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  
  lVar104 = (long)(int)((h + 6U) * 0x80);
  *(undefined1 (*) [16])(auStack_86b8 + lVar104 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_86c8 + lVar104 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_86d8 + lVar104 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_86e8 + lVar104 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_86f8 + lVar104 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_8708 + lVar104 * 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_8728 + lVar104 + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(auStack_8728 + lVar104) = (undefined1  [16])0x0;
  cVar20 = (char)conv_params->round_0;
  if (-6 < h) {
    puVar105 = src + src_stride * -3 + -3;
    iVar109 = (1 << (cVar20 - 1U & 0x1f)) + 0x4000;
    uVar103 = *(undefined4 *)filter_x;
    auVar116._0_8_ = CONCAT26(filter_x[3] + 0x80,*(undefined6 *)filter_x);
    auVar116._8_2_ = filter_x[4];
    auVar116._10_2_ = filter_x[5];
    auVar120._12_2_ = filter_x[6];
    auVar120._0_12_ = auVar116;
    auVar120._14_2_ = filter_x[7];
    uVar113 = (undefined4)((ulong)auVar116._0_8_ >> 0x20);
    uVar114 = auVar116._8_4_;
    uVar115 = auVar120._12_4_;
    auVar118._4_4_ = uVar113;
    auVar118._0_4_ = uVar113;
    auVar118._8_4_ = uVar113;
    auVar118._12_4_ = uVar113;
    auVar132._4_4_ = uVar103;
    auVar132._0_4_ = uVar103;
    auVar132._8_4_ = uVar103;
    auVar132._12_4_ = uVar103;
    auVar120 = ZEXT416((uint)~(-1 << (0x10U - cVar20 & 0x1f)));
    auVar120 = pshuflw(auVar120,auVar120,0);
    uVar106 = 0;
    auVar130 = ZEXT416((uint)conv_params->round_0);
    do {
      if (0 < w) {
        lVar104 = 0;
        do {
          auVar141 = *(undefined1 (*) [16])(puVar105 + lVar104);
          uVar139 = auVar141[7];
          auVar21[0xd] = 0;
          auVar21._0_13_ = auVar141._0_13_;
          auVar21[0xe] = uVar139;
          uVar138 = auVar141[6];
          auVar30[0xc] = uVar138;
          auVar30._0_12_ = auVar141._0_12_;
          auVar30._13_2_ = auVar21._13_2_;
          auVar39[0xb] = 0;
          auVar39._0_11_ = auVar141._0_11_;
          auVar39._12_3_ = auVar30._12_3_;
          uVar137 = auVar141[5];
          auVar47[10] = uVar137;
          auVar47._0_10_ = auVar141._0_10_;
          auVar47._11_4_ = auVar39._11_4_;
          auVar55[9] = 0;
          auVar55._0_9_ = auVar141._0_9_;
          auVar55._10_5_ = auVar47._10_5_;
          uVar136 = auVar141[4];
          auVar63[8] = uVar136;
          auVar63._0_8_ = auVar141._0_8_;
          auVar63._9_6_ = auVar55._9_6_;
          auVar79._7_8_ = 0;
          auVar79._0_7_ = auVar63._8_7_;
          uVar135 = auVar141[3];
          auVar87._1_8_ = SUB158(auVar79 << 0x40,7);
          auVar87[0] = uVar135;
          auVar87._9_6_ = 0;
          auVar88._1_10_ = SUB1510(auVar87 << 0x30,5);
          auVar88[0] = auVar141[2];
          auVar88._11_4_ = 0;
          auVar71[2] = auVar141[1];
          auVar71._0_2_ = auVar141._0_2_;
          auVar71._3_12_ = SUB1512(auVar88 << 0x20,3);
          auVar144._0_2_ = auVar141._0_2_ & 0xff;
          auVar144._2_13_ = auVar71._2_13_;
          auVar144[0xf] = 0;
          auVar133 = pmaddwd(auVar144,auVar132);
          uVar148 = auVar141[9];
          auVar22[0xd] = 0;
          auVar22._0_13_ = auVar141._2_13_;
          auVar22[0xe] = uVar148;
          uVar147 = auVar141[8];
          auVar31[0xc] = uVar147;
          auVar31._0_12_ = auVar141._2_12_;
          auVar31._13_2_ = auVar22._13_2_;
          auVar40[0xb] = 0;
          auVar40._0_11_ = auVar141._2_11_;
          auVar40._12_3_ = auVar31._12_3_;
          auVar48[10] = uVar139;
          auVar48._0_10_ = auVar141._2_10_;
          auVar48._11_4_ = auVar40._11_4_;
          auVar56[9] = 0;
          auVar56._0_9_ = auVar141._2_9_;
          auVar56._10_5_ = auVar48._10_5_;
          auVar64[8] = uVar138;
          auVar64._0_8_ = auVar141._2_8_;
          auVar64._9_6_ = auVar56._9_6_;
          auVar80._7_8_ = 0;
          auVar80._0_7_ = auVar64._8_7_;
          auVar89._1_8_ = SUB158(auVar80 << 0x40,7);
          auVar89[0] = uVar137;
          auVar89._9_6_ = 0;
          auVar90._1_10_ = SUB1510(auVar89 << 0x30,5);
          auVar90[0] = uVar136;
          auVar90._11_4_ = 0;
          auVar72[2] = uVar135;
          auVar72._0_2_ = auVar141._2_2_;
          auVar72._3_12_ = SUB1512(auVar90 << 0x20,3);
          auVar143._0_2_ = auVar141._2_2_ & 0xff;
          auVar143._2_13_ = auVar72._2_13_;
          auVar143[0xf] = 0;
          auVar144 = pmaddwd(auVar143,auVar118);
          auVar149._0_12_ = auVar141._4_12_;
          auVar149._12_4_ = auVar141._12_4_;
          uVar154 = auVar141[0xb];
          auVar23[0xd] = 0;
          auVar23._0_13_ = auVar149._0_13_;
          auVar23[0xe] = uVar154;
          uVar153 = auVar141[10];
          auVar32[0xc] = uVar153;
          auVar32._0_12_ = auVar149._0_12_;
          auVar32._13_2_ = auVar23._13_2_;
          auVar41[0xb] = 0;
          auVar41._0_11_ = auVar141._4_11_;
          auVar41._12_3_ = auVar32._12_3_;
          auVar49[10] = uVar148;
          auVar49._0_10_ = auVar141._4_10_;
          auVar49._11_4_ = auVar41._11_4_;
          auVar57[9] = 0;
          auVar57._0_9_ = auVar141._4_9_;
          auVar57._10_5_ = auVar49._10_5_;
          auVar65[8] = uVar147;
          auVar65._0_8_ = auVar141._4_8_;
          auVar65._9_6_ = auVar57._9_6_;
          auVar81._7_8_ = 0;
          auVar81._0_7_ = auVar65._8_7_;
          auVar91._1_8_ = SUB158(auVar81 << 0x40,7);
          auVar91[0] = uVar139;
          auVar91._9_6_ = 0;
          auVar92._1_10_ = SUB1510(auVar91 << 0x30,5);
          auVar92[0] = uVar138;
          auVar92._11_4_ = 0;
          auVar73[2] = uVar137;
          auVar73._0_2_ = auVar141._4_2_;
          auVar73._3_12_ = SUB1512(auVar92 << 0x20,3);
          auVar150._0_2_ = auVar141._4_2_ & 0xff;
          auVar150._2_13_ = auVar73._2_13_;
          auVar150[0xf] = 0;
          auVar151._4_4_ = uVar114;
          auVar151._0_4_ = uVar114;
          auVar151._8_4_ = uVar114;
          auVar151._12_4_ = uVar114;
          auVar151 = pmaddwd(auVar150,auVar151);
          auVar24 = auVar141._3_13_;
          auVar25[0xd] = 0;
          auVar25._0_13_ = auVar24 >> 0x18;
          auVar25[0xe] = auVar141[0xd];
          uVar162 = auVar141[0xc];
          auVar34[0xc] = uVar162;
          auVar34._0_12_ = auVar149._0_12_ >> 0x10;
          auVar34._13_2_ = auVar25._13_2_;
          auVar33 = auVar141._5_11_;
          auVar42[0xb] = 0;
          auVar42._0_11_ = auVar33 >> 8;
          auVar42._12_3_ = auVar34._12_3_;
          auVar50[10] = uVar154;
          auVar50._0_10_ = auVar141._6_10_;
          auVar50._11_4_ = auVar42._11_4_;
          auVar58[9] = 0;
          auVar58._0_9_ = auVar141._6_9_;
          auVar58._10_5_ = auVar50._10_5_;
          auVar66[8] = uVar153;
          auVar66._0_8_ = auVar141._6_8_;
          auVar66._9_6_ = auVar58._9_6_;
          auVar82._7_8_ = 0;
          auVar82._0_7_ = auVar66._8_7_;
          auVar93._1_8_ = SUB158(auVar82 << 0x40,7);
          auVar93[0] = uVar148;
          auVar93._9_6_ = 0;
          auVar94._1_10_ = SUB1510(auVar93 << 0x30,5);
          auVar94[0] = uVar147;
          auVar94._11_4_ = 0;
          auVar74[2] = uVar139;
          auVar74._0_2_ = auVar141._6_2_;
          auVar74._3_12_ = SUB1512(auVar94 << 0x20,3);
          auVar155._0_2_ = auVar141._6_2_ & 0xff;
          auVar155._2_13_ = auVar74._2_13_;
          auVar155[0xf] = 0;
          auVar156._4_4_ = uVar115;
          auVar156._0_4_ = uVar115;
          auVar156._8_4_ = uVar115;
          auVar156._12_4_ = uVar115;
          auVar156 = pmaddwd(auVar155,auVar156);
          auVar167._0_4_ =
               auVar133._0_4_ + iVar109 + auVar144._0_4_ + auVar156._0_4_ + auVar151._0_4_ >>
               auVar130;
          auVar167._4_4_ =
               auVar133._4_4_ + iVar109 + auVar144._4_4_ + auVar156._4_4_ + auVar151._4_4_ >>
               auVar130;
          auVar167._8_4_ =
               auVar133._8_4_ + iVar109 + auVar144._8_4_ + auVar156._8_4_ + auVar151._8_4_ >>
               auVar130;
          auVar167._12_4_ =
               auVar133._12_4_ + iVar109 + auVar144._12_4_ + auVar156._12_4_ + auVar151._12_4_ >>
               auVar130;
          auVar26[0xd] = 0;
          auVar26._0_13_ = auVar141._1_13_;
          auVar26[0xe] = uVar147;
          auVar35[0xc] = uVar139;
          auVar35._0_12_ = auVar141._1_12_;
          auVar35._13_2_ = auVar26._13_2_;
          auVar43[0xb] = 0;
          auVar43._0_11_ = auVar141._1_11_;
          auVar43._12_3_ = auVar35._12_3_;
          auVar51[10] = uVar138;
          auVar51._0_10_ = auVar141._1_10_;
          auVar51._11_4_ = auVar43._11_4_;
          auVar59[9] = 0;
          auVar59._0_9_ = auVar141._1_9_;
          auVar59._10_5_ = auVar51._10_5_;
          auVar67[8] = uVar137;
          auVar67._0_8_ = auVar141._1_8_;
          auVar67._9_6_ = auVar59._9_6_;
          auVar83._7_8_ = 0;
          auVar83._0_7_ = auVar67._8_7_;
          auVar95._1_8_ = SUB158(auVar83 << 0x40,7);
          auVar95[0] = uVar136;
          auVar95._9_6_ = 0;
          auVar96._1_10_ = SUB1510(auVar95 << 0x30,5);
          auVar96[0] = uVar135;
          auVar96._11_4_ = 0;
          auVar75[2] = auVar141[2];
          auVar75._0_2_ = auVar141._1_2_;
          auVar75._3_12_ = SUB1512(auVar96 << 0x20,3);
          auVar145._0_2_ = auVar141._1_2_ & 0xff;
          auVar145._2_13_ = auVar75._2_13_;
          auVar145[0xf] = 0;
          auVar156 = pmaddwd(auVar145,auVar132);
          auVar27[0xd] = 0;
          auVar27._0_13_ = auVar24;
          auVar27[0xe] = uVar153;
          auVar36[0xc] = uVar148;
          auVar36._0_12_ = auVar141._3_12_;
          auVar36._13_2_ = auVar27._13_2_;
          auVar44[0xb] = 0;
          auVar44._0_11_ = auVar141._3_11_;
          auVar44._12_3_ = auVar36._12_3_;
          auVar52[10] = uVar147;
          auVar52._0_10_ = auVar141._3_10_;
          auVar52._11_4_ = auVar44._11_4_;
          auVar60[9] = 0;
          auVar60._0_9_ = auVar141._3_9_;
          auVar60._10_5_ = auVar52._10_5_;
          auVar68[8] = uVar139;
          auVar68._0_8_ = auVar141._3_8_;
          auVar68._9_6_ = auVar60._9_6_;
          auVar84._7_8_ = 0;
          auVar84._0_7_ = auVar68._8_7_;
          auVar97._1_8_ = SUB158(auVar84 << 0x40,7);
          auVar97[0] = uVar138;
          auVar97._9_6_ = 0;
          auVar98._1_10_ = SUB1510(auVar97 << 0x30,5);
          auVar98[0] = uVar137;
          auVar98._11_4_ = 0;
          auVar76[2] = uVar136;
          auVar76._0_2_ = auVar141._3_2_;
          auVar76._3_12_ = SUB1512(auVar98 << 0x20,3);
          auVar152._0_2_ = auVar141._3_2_ & 0xff;
          auVar152._2_13_ = auVar76._2_13_;
          auVar152[0xf] = 0;
          auVar151 = pmaddwd(auVar152,auVar118);
          auVar28[0xd] = 0;
          auVar28._0_13_ = auVar24 >> 0x10;
          auVar28[0xe] = uVar162;
          auVar37[0xc] = uVar154;
          auVar37._0_12_ = auVar149._0_12_ >> 8;
          auVar37._13_2_ = auVar28._13_2_;
          auVar45[0xb] = 0;
          auVar45._0_11_ = auVar33;
          auVar45._12_3_ = auVar37._12_3_;
          auVar53[10] = uVar153;
          auVar53._0_10_ = auVar141._5_10_;
          auVar53._11_4_ = auVar45._11_4_;
          auVar61[9] = 0;
          auVar61._0_9_ = auVar141._5_9_;
          auVar61._10_5_ = auVar53._10_5_;
          auVar69[8] = uVar148;
          auVar69._0_8_ = auVar141._5_8_;
          auVar69._9_6_ = auVar61._9_6_;
          auVar85._7_8_ = 0;
          auVar85._0_7_ = auVar69._8_7_;
          auVar99._1_8_ = SUB158(auVar85 << 0x40,7);
          auVar99[0] = uVar147;
          auVar99._9_6_ = 0;
          auVar100._1_10_ = SUB1510(auVar99 << 0x30,5);
          auVar100[0] = uVar139;
          auVar100._11_4_ = 0;
          auVar77[2] = uVar138;
          auVar77._0_2_ = auVar141._5_2_;
          auVar77._3_12_ = SUB1512(auVar100 << 0x20,3);
          auVar157._0_2_ = auVar141._5_2_ & 0xff;
          auVar157._2_13_ = auVar77._2_13_;
          auVar157[0xf] = 0;
          auVar133._4_4_ = uVar114;
          auVar133._0_4_ = uVar114;
          auVar133._8_4_ = uVar114;
          auVar133._12_4_ = uVar114;
          auVar133 = pmaddwd(auVar157,auVar133);
          auVar29[0xd] = 0;
          auVar29._0_13_ = auVar24 >> 0x20;
          auVar29[0xe] = auVar141[0xe];
          auVar38[0xc] = auVar141[0xd];
          auVar38._0_12_ = auVar149._0_12_ >> 0x18;
          auVar38._13_2_ = auVar29._13_2_;
          auVar46[0xb] = 0;
          auVar46._0_11_ = auVar33 >> 0x10;
          auVar46._12_3_ = auVar38._12_3_;
          auVar54[10] = uVar162;
          auVar54._0_10_ = auVar141._6_10_ >> 8;
          auVar54._11_4_ = auVar46._11_4_;
          auVar62[9] = 0;
          auVar62._0_9_ = auVar141._7_9_;
          auVar62._10_5_ = auVar54._10_5_;
          auVar70[8] = uVar154;
          auVar70._0_8_ = auVar141._7_8_;
          auVar70._9_6_ = auVar62._9_6_;
          auVar86._7_8_ = 0;
          auVar86._0_7_ = auVar70._8_7_;
          auVar101._1_8_ = SUB158(auVar86 << 0x40,7);
          auVar101[0] = uVar153;
          auVar101._9_6_ = 0;
          auVar102._1_10_ = SUB1510(auVar101 << 0x30,5);
          auVar102[0] = uVar148;
          auVar102._11_4_ = 0;
          auVar78[2] = uVar147;
          auVar78._0_2_ = auVar141._7_2_;
          auVar78._3_12_ = SUB1512(auVar102 << 0x20,3);
          auVar140._0_2_ = auVar141._7_2_ & 0xff;
          auVar140._2_13_ = auVar78._2_13_;
          auVar140[0xf] = 0;
          auVar141._4_4_ = uVar115;
          auVar141._0_4_ = uVar115;
          auVar141._8_4_ = uVar115;
          auVar141._12_4_ = uVar115;
          auVar141 = pmaddwd(auVar140,auVar141);
          auVar146._0_4_ =
               auVar156._0_4_ + iVar109 + auVar133._0_4_ + auVar151._0_4_ + auVar141._0_4_ >>
               auVar130;
          auVar146._4_4_ =
               auVar156._4_4_ + iVar109 + auVar133._4_4_ + auVar151._4_4_ + auVar141._4_4_ >>
               auVar130;
          auVar146._8_4_ =
               auVar156._8_4_ + iVar109 + auVar133._8_4_ + auVar151._8_4_ + auVar141._8_4_ >>
               auVar130;
          auVar146._12_4_ =
               auVar156._12_4_ + iVar109 + auVar133._12_4_ + auVar151._12_4_ + auVar141._12_4_ >>
               auVar130;
          auVar141 = packssdw(auVar167,auVar146);
          sVar1 = (ushort)(-1 < auVar141._0_2_) * auVar141._0_2_;
          sVar2 = (ushort)(-1 < auVar141._2_2_) * auVar141._2_2_;
          sVar3 = (ushort)(-1 < auVar141._4_2_) * auVar141._4_2_;
          sVar4 = (ushort)(-1 < auVar141._6_2_) * auVar141._6_2_;
          sVar5 = (ushort)(-1 < auVar141._8_2_) * auVar141._8_2_;
          sVar6 = (ushort)(-1 < auVar141._10_2_) * auVar141._10_2_;
          sVar7 = (ushort)(-1 < auVar141._12_2_) * auVar141._12_2_;
          sVar8 = (ushort)(-1 < auVar141._14_2_) * auVar141._14_2_;
          sVar14 = auVar120._0_2_;
          sVar15 = auVar120._2_2_;
          puVar9 = auStack_8728 + (ulong)((uint)uVar106 & 0x1ffffff) * 0x80 + lVar104;
          *puVar9 = (ushort)(sVar14 < sVar1) * sVar14 | (ushort)(sVar14 >= sVar1) * sVar1;
          puVar9[1] = (ushort)(sVar15 < sVar2) * sVar15 | (ushort)(sVar15 >= sVar2) * sVar2;
          puVar9[2] = (ushort)(sVar14 < sVar3) * sVar14 | (ushort)(sVar14 >= sVar3) * sVar3;
          puVar9[3] = (ushort)(sVar15 < sVar4) * sVar15 | (ushort)(sVar15 >= sVar4) * sVar4;
          puVar9[4] = (ushort)(sVar14 < sVar5) * sVar14 | (ushort)(sVar14 >= sVar5) * sVar5;
          puVar9[5] = (ushort)(sVar15 < sVar6) * sVar15 | (ushort)(sVar15 >= sVar6) * sVar6;
          puVar9[6] = (ushort)(sVar14 < sVar7) * sVar14 | (ushort)(sVar14 >= sVar7) * sVar7;
          puVar9[7] = (ushort)(sVar15 < sVar8) * sVar15 | (ushort)(sVar15 >= sVar8) * sVar8;
          lVar104 = lVar104 + 8;
        } while (lVar104 < w);
      }
      uVar106 = uVar106 + 1;
      puVar105 = puVar105 + src_stride;
    } while (uVar106 != h + 6U);
  }
  cVar20 = (char)conv_params->round_1;
  if (0 < h) {
    iVar109 = (-1 << (cVar20 + 7U & 0x1f)) + (1 << (cVar20 - 1U & 0x1f));
    uVar103 = *(undefined4 *)filter_y;
    auVar110._0_8_ = CONCAT26(filter_y[3] + 0x80,*(undefined6 *)filter_y);
    auVar110._8_2_ = filter_y[4];
    auVar110._10_2_ = filter_y[5];
    auVar111._12_2_ = filter_y[6];
    auVar111._0_12_ = auVar110;
    auVar111._14_2_ = filter_y[7];
    uVar113 = (undefined4)((ulong)auVar110._0_8_ >> 0x20);
    uVar114 = auVar110._8_4_;
    uVar115 = auVar111._12_4_;
    auVar130._4_4_ = uVar115;
    auVar130._0_4_ = uVar115;
    auVar130._8_4_ = uVar115;
    auVar130._12_4_ = uVar115;
    auVar112._4_4_ = uVar103;
    auVar112._0_4_ = uVar103;
    auVar112._8_4_ = uVar103;
    auVar112._12_4_ = uVar103;
    uVar106 = 0;
    do {
      if (0 < w) {
        uVar107 = (ulong)((uint)uVar106 & 0x1ffffff);
        lVar108 = uVar107 * 0x100;
        lVar104 = 0;
        do {
          auVar118 = *(undefined1 (*) [16])(auStack_8728 + uVar107 * 0x80 + lVar104);
          puVar11 = auStack_8628 + uVar107 * 0x80 + lVar104;
          auVar120 = *(undefined1 (*) [16])(auStack_8528 + lVar104 * 2 + lVar108);
          auVar124._0_12_ = auVar118._0_12_;
          auVar124._12_2_ = auVar118._6_2_;
          auVar124._14_2_ = puVar11[3];
          auVar123._12_4_ = auVar124._12_4_;
          auVar123._0_10_ = auVar118._0_10_;
          auVar123._10_2_ = puVar11[2];
          auVar122._10_6_ = auVar123._10_6_;
          auVar122._0_8_ = auVar118._0_8_;
          auVar122._8_2_ = auVar118._4_2_;
          auVar121._8_8_ = auVar122._8_8_;
          auVar121._6_2_ = puVar11[1];
          auVar121._4_2_ = auVar118._2_2_;
          auVar121._0_2_ = auVar118._0_2_;
          auVar121._2_2_ = *puVar11;
          puVar12 = auStack_8428 + uVar107 * 0x80 + lVar104;
          auVar161._0_12_ = auVar120._0_12_;
          auVar161._12_2_ = auVar120._6_2_;
          auVar161._14_2_ = puVar12[3];
          auVar160._12_4_ = auVar161._12_4_;
          auVar160._0_10_ = auVar120._0_10_;
          auVar160._10_2_ = puVar12[2];
          auVar159._10_6_ = auVar160._10_6_;
          auVar159._0_8_ = auVar120._0_8_;
          auVar159._8_2_ = auVar120._4_2_;
          auVar158._8_8_ = auVar159._8_8_;
          auVar158._6_2_ = puVar12[1];
          auVar158._4_2_ = auVar120._2_2_;
          auVar158._0_2_ = auVar120._0_2_;
          auVar158._2_2_ = *puVar12;
          auVar132 = *(undefined1 (*) [16])(auStack_8328 + lVar104 * 2 + lVar108);
          puVar13 = auStack_8228 + uVar107 * 0x80 + lVar104;
          auVar166._0_12_ = auVar132._0_12_;
          auVar166._12_2_ = auVar132._6_2_;
          auVar166._14_2_ = puVar13[3];
          auVar165._12_4_ = auVar166._12_4_;
          auVar165._0_10_ = auVar132._0_10_;
          auVar165._10_2_ = puVar13[2];
          auVar164._10_6_ = auVar165._10_6_;
          auVar164._0_8_ = auVar132._0_8_;
          auVar164._8_2_ = auVar132._4_2_;
          auVar163._8_8_ = auVar164._8_8_;
          auVar163._6_2_ = puVar13[1];
          auVar163._4_2_ = auVar132._2_2_;
          auVar163._0_2_ = auVar132._0_2_;
          auVar163._2_2_ = *puVar13;
          auVar141 = *(undefined1 (*) [16])(auStack_8128 + lVar104 * 2 + lVar108);
          puVar10 = local_8028 + uVar107 * 0x80 + lVar104;
          auVar156 = pmaddwd(auVar121,auVar112);
          auVar18._4_4_ = uVar113;
          auVar18._0_4_ = uVar113;
          auVar18._8_4_ = uVar113;
          auVar18._12_4_ = uVar113;
          auVar144 = pmaddwd(auVar158,auVar18);
          auVar128._0_12_ = auVar141._0_12_;
          auVar128._12_2_ = auVar141._6_2_;
          auVar128._14_2_ = puVar10[3];
          auVar127._12_4_ = auVar128._12_4_;
          auVar127._0_10_ = auVar141._0_10_;
          auVar127._10_2_ = puVar10[2];
          auVar126._10_6_ = auVar127._10_6_;
          auVar126._0_8_ = auVar141._0_8_;
          auVar126._8_2_ = auVar141._4_2_;
          auVar125._8_8_ = auVar126._8_8_;
          auVar125._6_2_ = puVar10[1];
          auVar125._4_2_ = auVar141._2_2_;
          auVar125._0_2_ = auVar141._0_2_;
          auVar125._2_2_ = *puVar10;
          auVar16._4_4_ = uVar114;
          auVar16._0_4_ = uVar114;
          auVar16._8_4_ = uVar114;
          auVar16._12_4_ = uVar114;
          auVar167 = pmaddwd(auVar163,auVar16);
          auVar151 = pmaddwd(auVar125,auVar130);
          auVar131._2_2_ = puVar11[4];
          auVar131._0_2_ = auVar118._8_2_;
          auVar131._4_2_ = auVar118._10_2_;
          auVar131._6_2_ = puVar11[5];
          auVar131._8_2_ = auVar118._12_2_;
          auVar131._10_2_ = puVar11[6];
          auVar131._12_2_ = auVar118._14_2_;
          auVar131._14_2_ = puVar11[7];
          auVar117._2_2_ = puVar12[4];
          auVar117._0_2_ = auVar120._8_2_;
          auVar117._4_2_ = auVar120._10_2_;
          auVar117._6_2_ = puVar12[5];
          auVar117._8_2_ = auVar120._12_2_;
          auVar117._10_2_ = puVar12[6];
          auVar117._12_2_ = auVar120._14_2_;
          auVar117._14_2_ = puVar12[7];
          auVar142._2_2_ = puVar13[4];
          auVar142._0_2_ = auVar132._8_2_;
          auVar142._4_2_ = auVar132._10_2_;
          auVar142._6_2_ = puVar13[5];
          auVar142._8_2_ = auVar132._12_2_;
          auVar142._10_2_ = puVar13[6];
          auVar142._12_2_ = auVar132._14_2_;
          auVar142._14_2_ = puVar13[7];
          auVar134._2_2_ = puVar10[4];
          auVar134._0_2_ = auVar141._8_2_;
          auVar134._4_2_ = auVar141._10_2_;
          auVar134._6_2_ = puVar10[5];
          auVar134._8_2_ = auVar141._12_2_;
          auVar134._10_2_ = puVar10[6];
          auVar134._12_2_ = auVar141._14_2_;
          auVar134._14_2_ = puVar10[7];
          auVar120 = pmaddwd(auVar131,auVar112);
          auVar19._4_4_ = uVar113;
          auVar19._0_4_ = uVar113;
          auVar19._8_4_ = uVar113;
          auVar19._12_4_ = uVar113;
          auVar118 = pmaddwd(auVar117,auVar19);
          auVar17._4_4_ = uVar114;
          auVar17._0_4_ = uVar114;
          auVar17._8_4_ = uVar114;
          auVar17._12_4_ = uVar114;
          auVar133 = pmaddwd(auVar142,auVar17);
          auVar141 = pmaddwd(auVar134,auVar130);
          auVar132 = ZEXT416((uint)conv_params->round_1);
          auVar119._0_4_ =
               auVar151._0_4_ + auVar167._0_4_ + auVar144._0_4_ + auVar156._0_4_ + iVar109 >>
               auVar132;
          auVar119._4_4_ =
               auVar141._0_4_ + auVar133._0_4_ + auVar118._0_4_ + auVar120._0_4_ + iVar109 >>
               auVar132;
          auVar119._8_4_ =
               auVar151._4_4_ + auVar167._4_4_ + auVar144._4_4_ + auVar156._4_4_ + iVar109 >>
               auVar132;
          auVar119._12_4_ =
               auVar141._4_4_ + auVar133._4_4_ + auVar118._4_4_ + auVar120._4_4_ + iVar109 >>
               auVar132;
          auVar129._0_4_ =
               auVar151._8_4_ + auVar167._8_4_ + auVar144._8_4_ + auVar156._8_4_ + iVar109 >>
               auVar132;
          auVar129._4_4_ =
               auVar141._8_4_ + auVar133._8_4_ + auVar118._8_4_ + auVar120._8_4_ + iVar109 >>
               auVar132;
          auVar129._8_4_ =
               auVar151._12_4_ + auVar167._12_4_ + auVar144._12_4_ + auVar156._12_4_ + iVar109 >>
               auVar132;
          auVar129._12_4_ =
               auVar141._12_4_ + auVar133._12_4_ + auVar118._12_4_ + auVar120._12_4_ + iVar109 >>
               auVar132;
          auVar118 = packssdw(auVar119,auVar129);
          sVar2 = auVar118._0_2_;
          sVar3 = auVar118._2_2_;
          sVar4 = auVar118._4_2_;
          sVar5 = auVar118._6_2_;
          sVar6 = auVar118._8_2_;
          sVar7 = auVar118._10_2_;
          sVar8 = auVar118._12_2_;
          sVar1 = auVar118._14_2_;
          *(ulong *)(dst + lVar104) =
               CONCAT17((0 < sVar1) * (sVar1 < 0x100) * auVar118[0xe] - (0xff < sVar1),
                        CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar118[0xc] - (0xff < sVar8),
                                 CONCAT15((0 < sVar7) * (sVar7 < 0x100) * auVar118[10] -
                                          (0xff < sVar7),
                                          CONCAT14((0 < sVar6) * (sVar6 < 0x100) * auVar118[8] -
                                                   (0xff < sVar6),
                                                   CONCAT13((0 < sVar5) * (sVar5 < 0x100) *
                                                            auVar118[6] - (0xff < sVar5),
                                                            CONCAT12((0 < sVar4) * (sVar4 < 0x100) *
                                                                     auVar118[4] - (0xff < sVar4),
                                                                     CONCAT11((0 < sVar3) *
                                                                              (sVar3 < 0x100) *
                                                                              auVar118[2] -
                                                                              (0xff < sVar3),
                                                                              (0 < sVar2) *
                                                                              (sVar2 < 0x100) *
                                                                              auVar118[0] -
                                                                              (0xff < sVar2))))))));
          lVar104 = lVar104 + 8;
        } while (lVar104 < w);
      }
      uVar106 = uVar106 + 1;
      dst = dst + dst_stride;
    } while (uVar106 != (uint)h);
  }
  return;
}

Assistant:

void av1_wiener_convolve_add_src_sse2(const uint8_t *src, ptrdiff_t src_stride,
                                      uint8_t *dst, ptrdiff_t dst_stride,
                                      const int16_t *filter_x, int x_step_q4,
                                      const int16_t *filter_y, int y_step_q4,
                                      int w, int h,
                                      const WienerConvolveParams *conv_params) {
  const int bd = 8;
  assert(x_step_q4 == 16 && y_step_q4 == 16);
  assert(!(w & 7));
  (void)x_step_q4;
  (void)y_step_q4;

  DECLARE_ALIGNED(16, uint16_t,
                  temp[(MAX_SB_SIZE + SUBPEL_TAPS - 1) * MAX_SB_SIZE]);
  int intermediate_height = h + SUBPEL_TAPS - 2;
  memset(temp + (intermediate_height * MAX_SB_SIZE), 0, MAX_SB_SIZE);
  int i, j;
  const int center_tap = ((SUBPEL_TAPS - 1) / 2);
  const uint8_t *const src_ptr = src - center_tap * src_stride - center_tap;

  const __m128i zero = _mm_setzero_si128();
  // Add an offset to account for the "add_src" part of the convolve function.
  const __m128i offset = _mm_insert_epi16(zero, 1 << FILTER_BITS, 3);

  /* Horizontal filter */
  {
    const __m128i coeffs_x =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_x), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_x, coeffs_x);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_x, coeffs_x);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const = _mm_set1_epi32(
        (1 << (conv_params->round_0 - 1)) + (1 << (bd + FILTER_BITS - 1)));

    for (i = 0; i < intermediate_height; ++i) {
      for (j = 0; j < w; j += 8) {
        const __m128i data =
            _mm_loadu_si128((__m128i *)&src_ptr[i * src_stride + j]);

        // Filter even-index pixels
        const __m128i src_0 = _mm_unpacklo_epi8(data, zero);
        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i src_2 = _mm_unpacklo_epi8(_mm_srli_si128(data, 2), zero);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i src_4 = _mm_unpacklo_epi8(_mm_srli_si128(data, 4), zero);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i src_6 = _mm_unpacklo_epi8(_mm_srli_si128(data, 6), zero);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_4),
                                         _mm_add_epi32(res_2, res_6));
        res_even = _mm_srai_epi32(_mm_add_epi32(res_even, round_const),
                                  conv_params->round_0);

        // Filter odd-index pixels
        const __m128i src_1 = _mm_unpacklo_epi8(_mm_srli_si128(data, 1), zero);
        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i src_3 = _mm_unpacklo_epi8(_mm_srli_si128(data, 3), zero);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i src_5 = _mm_unpacklo_epi8(_mm_srli_si128(data, 5), zero);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i src_7 = _mm_unpacklo_epi8(_mm_srli_si128(data, 7), zero);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_5),
                                        _mm_add_epi32(res_3, res_7));
        res_odd = _mm_srai_epi32(_mm_add_epi32(res_odd, round_const),
                                 conv_params->round_0);

        // Pack in the column order 0, 2, 4, 6, 1, 3, 5, 7
        __m128i res = _mm_packs_epi32(res_even, res_odd);
        res = _mm_min_epi16(
            _mm_max_epi16(res, zero),
            _mm_set1_epi16(WIENER_CLAMP_LIMIT(conv_params->round_0, bd) - 1));
        _mm_storeu_si128((__m128i *)&temp[i * MAX_SB_SIZE + j], res);
      }
    }
  }

  /* Vertical filter */
  {
    const __m128i coeffs_y =
        _mm_add_epi16(_mm_loadu_si128((__m128i *)filter_y), offset);

    // coeffs 0 1 0 1 2 3 2 3
    const __m128i tmp_0 = _mm_unpacklo_epi32(coeffs_y, coeffs_y);
    // coeffs 4 5 4 5 6 7 6 7
    const __m128i tmp_1 = _mm_unpackhi_epi32(coeffs_y, coeffs_y);

    // coeffs 0 1 0 1 0 1 0 1
    const __m128i coeff_01 = _mm_unpacklo_epi64(tmp_0, tmp_0);
    // coeffs 2 3 2 3 2 3 2 3
    const __m128i coeff_23 = _mm_unpackhi_epi64(tmp_0, tmp_0);
    // coeffs 4 5 4 5 4 5 4 5
    const __m128i coeff_45 = _mm_unpacklo_epi64(tmp_1, tmp_1);
    // coeffs 6 7 6 7 6 7 6 7
    const __m128i coeff_67 = _mm_unpackhi_epi64(tmp_1, tmp_1);

    const __m128i round_const =
        _mm_set1_epi32((1 << (conv_params->round_1 - 1)) -
                       (1 << (bd + conv_params->round_1 - 1)));

    for (i = 0; i < h; ++i) {
      for (j = 0; j < w; j += 8) {
        // Filter even-index pixels
        const uint16_t *data = &temp[i * MAX_SB_SIZE + j];
        const __m128i src_0 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_2 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_4 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_6 =
            _mm_unpacklo_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_0 = _mm_madd_epi16(src_0, coeff_01);
        const __m128i res_2 = _mm_madd_epi16(src_2, coeff_23);
        const __m128i res_4 = _mm_madd_epi16(src_4, coeff_45);
        const __m128i res_6 = _mm_madd_epi16(src_6, coeff_67);

        const __m128i res_even = _mm_add_epi32(_mm_add_epi32(res_0, res_2),
                                               _mm_add_epi32(res_4, res_6));

        // Filter odd-index pixels
        const __m128i src_1 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 0 * MAX_SB_SIZE),
                               *(__m128i *)(data + 1 * MAX_SB_SIZE));
        const __m128i src_3 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 2 * MAX_SB_SIZE),
                               *(__m128i *)(data + 3 * MAX_SB_SIZE));
        const __m128i src_5 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 4 * MAX_SB_SIZE),
                               *(__m128i *)(data + 5 * MAX_SB_SIZE));
        const __m128i src_7 =
            _mm_unpackhi_epi16(*(__m128i *)(data + 6 * MAX_SB_SIZE),
                               *(__m128i *)(data + 7 * MAX_SB_SIZE));

        const __m128i res_1 = _mm_madd_epi16(src_1, coeff_01);
        const __m128i res_3 = _mm_madd_epi16(src_3, coeff_23);
        const __m128i res_5 = _mm_madd_epi16(src_5, coeff_45);
        const __m128i res_7 = _mm_madd_epi16(src_7, coeff_67);

        const __m128i res_odd = _mm_add_epi32(_mm_add_epi32(res_1, res_3),
                                              _mm_add_epi32(res_5, res_7));

        // Rearrange pixels back into the order 0 ... 7
        const __m128i res_lo = _mm_unpacklo_epi32(res_even, res_odd);
        const __m128i res_hi = _mm_unpackhi_epi32(res_even, res_odd);

        const __m128i res_lo_round = _mm_srai_epi32(
            _mm_add_epi32(res_lo, round_const), conv_params->round_1);
        const __m128i res_hi_round = _mm_srai_epi32(
            _mm_add_epi32(res_hi, round_const), conv_params->round_1);

        const __m128i res_16bit = _mm_packs_epi32(res_lo_round, res_hi_round);
        __m128i res_8bit = _mm_packus_epi16(res_16bit, res_16bit);

        __m128i *const p = (__m128i *)&dst[i * dst_stride + j];
        _mm_storel_epi64(p, res_8bit);
      }
    }
  }
}